

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O1

void __thiscall HBT_correlation::~HBT_correlation(HBT_correlation *this)

{
  pointer puVar1;
  pointer pdVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  
  if (this->invariant_radius_flag_ == 1) {
    delete_a_2D_array<double>(this,&this->q_inv_mean,this->n_KT);
    delete_a_2D_array<double>(this,&this->correl_1d_inv_num,this->n_KT);
    delete_a_2D_array<double>(this,&this->correl_1d_inv_num_count,this->n_KT);
    delete_a_2D_array<double>(this,&this->correl_1d_inv_denorm,this->n_KT);
  }
  if (this->azimuthal_flag_ == 0) {
    delete_a_4D_array<double>(this,&this->q_out_mean,this->n_KT,this->qnpts,this->qnpts);
    delete_a_4D_array<double>(this,&this->q_side_mean,this->n_KT,this->qnpts,this->qnpts);
    delete_a_4D_array<double>(this,&this->q_long_mean,this->n_KT,this->qnpts,this->qnpts);
    delete_a_4D_array<double>(this,&this->correl_3d_num,this->n_KT,this->qnpts,this->qnpts);
    delete_a_4D_array<double>(this,&this->correl_3d_num_count,this->n_KT,this->qnpts,this->qnpts);
    delete_a_4D_array<double>(this,&this->correl_3d_denorm,this->n_KT,this->qnpts,this->qnpts);
  }
  else {
    delete_a_5D_array<double>
              (this,&this->q_out_diff_mean,this->n_KT,this->n_Kphi,this->qnpts,this->qnpts);
    delete_a_5D_array<double>
              (this,&this->q_side_diff_mean,this->n_KT,this->n_Kphi,this->qnpts,this->qnpts);
    delete_a_5D_array<double>
              (this,&this->q_long_diff_mean,this->n_KT,this->n_Kphi,this->qnpts,this->qnpts);
    delete_a_5D_array<double>
              (this,&this->correl_3d_Kphi_diff_num,this->n_KT,this->n_Kphi,this->qnpts,this->qnpts);
    delete_a_5D_array<double>
              (this,&this->correl_3d_Kphi_diff_num_count,this->n_KT,this->n_Kphi,this->qnpts,
               this->qnpts);
    delete_a_5D_array<double>
              (this,&this->correl_3d_Kphi_diff_denorm,this->n_KT,this->n_Kphi,this->qnpts,
               this->qnpts);
  }
  if (this->azimuthal_flag_ == 1) {
    delete_a_2D_array<unsigned_long_long>
              (this,&this->number_of_pairs_numerator_KTKphidiff,this->n_KT);
    delete_a_2D_array<unsigned_long_long>
              (this,&this->number_of_pairs_denormenator_KTKphidiff,this->n_KT);
  }
  puVar1 = (this->number_of_pairs_denormenator_KTdiff_qinv_).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->number_of_pairs_numerator_KTdiff_qinv_).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->number_of_pairs_denormenator_KTdiff).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->number_of_pairs_numerator_KTdiff).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pdVar2 = (this->q_long).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->q_side).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->Kphi_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->KT_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pretty_ostream::~pretty_ostream(&this->messager);
  p_Var3 = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pcVar4 = (this->path_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(this->path_).field_2) {
    operator_delete(pcVar4);
  }
  ParameterReader::~ParameterReader(&this->paraRdr_);
  return;
}

Assistant:

HBT_correlation::~HBT_correlation() {
    if (invariant_radius_flag_ == 1) {
        delete_a_2D_array(q_inv_mean, n_KT);
        delete_a_2D_array(correl_1d_inv_num, n_KT);
        delete_a_2D_array(correl_1d_inv_num_count, n_KT);
        delete_a_2D_array(correl_1d_inv_denorm, n_KT);
    }

    if (azimuthal_flag_ == 0) {
        delete_a_4D_array(q_out_mean, n_KT, qnpts, qnpts);
        delete_a_4D_array(q_side_mean, n_KT, qnpts, qnpts);
        delete_a_4D_array(q_long_mean, n_KT, qnpts, qnpts);
        delete_a_4D_array(correl_3d_num, n_KT, qnpts, qnpts);
        delete_a_4D_array(correl_3d_num_count, n_KT, qnpts, qnpts);
        delete_a_4D_array(correl_3d_denorm, n_KT, qnpts, qnpts);
    } else {
        delete_a_5D_array(q_out_diff_mean, n_KT, n_Kphi, qnpts, qnpts);
        delete_a_5D_array(q_side_diff_mean, n_KT, n_Kphi, qnpts, qnpts);
        delete_a_5D_array(q_long_diff_mean, n_KT, n_Kphi, qnpts, qnpts);
        delete_a_5D_array(correl_3d_Kphi_diff_num, n_KT, n_Kphi, qnpts, qnpts);
        delete_a_5D_array(
            correl_3d_Kphi_diff_num_count, n_KT, n_Kphi, qnpts, qnpts);
        delete_a_5D_array(
            correl_3d_Kphi_diff_denorm, n_KT, n_Kphi, qnpts, qnpts);
    }

    if (azimuthal_flag_ == 1) {
        delete_a_2D_array(number_of_pairs_numerator_KTKphidiff, n_KT);
        delete_a_2D_array(number_of_pairs_denormenator_KTKphidiff, n_KT);
    }
}